

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O1

string * minutes_abi_cxx11_(string *__return_storage_ptr__,double seconds)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  double dVar9;
  undefined8 in_XMM3_Qb;
  string __str;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  double local_48;
  undefined8 uStack_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  int iVar4;
  
  dVar9 = seconds - (double)((int)(seconds / 60.0) * 0x3c);
  uVar8 = -(ulong)(dVar9 - (double)(int)dVar9 < 0.5);
  local_48 = (double)(~uVar8 & (ulong)(double)((int)dVar9 + 1) | (ulong)(double)(int)dVar9 & uVar8);
  iVar5 = (int)(seconds / 60.0) + (uint)(local_48 == 60.0);
  uStack_40 = in_XMM3_Qb;
  if ((local_48 == 60.0) && (!NAN(local_48))) {
    local_48 = 0.0;
    uStack_40 = 0;
  }
  uVar6 = iVar5 / 0x3c;
  iVar4 = 0;
  if (0x3b < iVar5) {
    iVar4 = uVar6 * -0x3c;
  }
  uVar3 = iVar4 + iVar5;
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (0x76 < iVar5 + 0x3bU) {
    uVar7 = -uVar6;
    if (0 < (int)uVar6) {
      uVar7 = uVar6;
    }
    uVar6 = 1;
    if (9 < uVar7) {
      uVar8 = (ulong)uVar7;
      uVar1 = 4;
      do {
        uVar6 = uVar1;
        uVar2 = (uint)uVar8;
        if (uVar2 < 100) {
          uVar6 = uVar6 - 2;
          goto LAB_0010f2e1;
        }
        if (uVar2 < 1000) {
          uVar6 = uVar6 - 1;
          goto LAB_0010f2e1;
        }
        if (uVar2 < 10000) goto LAB_0010f2e1;
        uVar8 = uVar8 / 10000;
        uVar1 = uVar6 + 4;
      } while (99999 < uVar2);
      uVar6 = uVar6 + 1;
    }
LAB_0010f2e1:
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct((ulong)local_68,(iVar5 < -0x3b) + (char)uVar6);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0] + (iVar5 < -0x3b),uVar6,uVar7);
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68[0]);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((int)uVar3 < 10) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  uVar6 = -uVar3;
  if (0 < (int)uVar3) {
    uVar6 = uVar3;
  }
  uVar7 = 1;
  if (9 < uVar6) {
    uVar8 = (ulong)uVar6;
    uVar1 = 4;
    do {
      uVar7 = uVar1;
      uVar2 = (uint)uVar8;
      if (uVar2 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_0010f3bc;
      }
      if (uVar2 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_0010f3bc;
      }
      if (uVar2 < 10000) goto LAB_0010f3bc;
      uVar8 = uVar8 / 10000;
      uVar1 = uVar7 + 4;
    } while (99999 < uVar2);
    uVar7 = uVar7 + 1;
  }
LAB_0010f3bc:
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)uVar7 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0] + (uVar3 >> 0x1f),uVar7,uVar6);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (local_48 < 10.0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  uVar3 = (uint)local_48;
  uVar6 = -uVar3;
  if (0 < (int)uVar3) {
    uVar6 = uVar3;
  }
  uVar7 = 1;
  if (9 < uVar6) {
    uVar8 = (ulong)uVar6;
    uVar1 = 4;
    do {
      uVar7 = uVar1;
      uVar2 = (uint)uVar8;
      if (uVar2 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_0010f49c;
      }
      if (uVar2 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_0010f49c;
      }
      if (uVar2 < 10000) goto LAB_0010f49c;
      uVar8 = uVar8 / 10000;
      uVar1 = uVar7 + 4;
    } while (99999 < uVar2);
    uVar7 = uVar7 + 1;
  }
LAB_0010f49c:
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct((ulong)local_68,(char)uVar7 - (char)((int)uVar3 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_68[0] + (uVar3 >> 0x1f),uVar7,uVar6);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_68[0]);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

string minutes(double seconds) {
	int minutes = seconds / 60;
	seconds = seconds - minutes * 60;
	if (seconds - int(seconds) >= 0.5) {
		seconds = int(seconds) + 1;
	} else{
		seconds = int(seconds);
	}
	if (seconds == 60) {
		minutes++;
		seconds = 0;
	}
	int hours = minutes / 60;
	if (hours >= 1) {
		minutes = minutes - hours * 60;
	}

	string output;
	if (hours) {
		output += to_string(hours);
		output += ":";
		if (minutes < 10) {
			output += "0";
		}
	}
	output += to_string(minutes);
	output += ":";
	if (seconds < 10) {
		output += "0";
	}
	int isec = seconds;
	output += to_string(isec);
	return output;
}